

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_check_files.cpp
# Opt level: O0

string * val_to_rnum_abi_cxx11_(string *__return_storage_ptr__,uint32_t i)

{
  bool bVar1;
  pointer ppVar2;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  _Self local_28;
  _Self local_20;
  const_iterator found;
  uint32_t i_local;
  
  found._M_node._4_4_ = i;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&numerals_abi_cxx11_,(key_type *)((long)&found._M_node + 4));
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&numerals_abi_cxx11_);
  bVar1 = std::operator==(&local_20,&local_28);
  if (bVar1) {
    std::__cxx11::to_string(&local_68,found._M_node._4_4_);
    std::operator+(&local_48,&local_68," is out of [1, 3999]");
    error(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  ppVar2 = std::
           _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_20);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar2->second);
  return __return_storage_ptr__;
}

Assistant:

std::string val_to_rnum(uint32_t i)
{
	auto found = numerals.find(i);
	if (found == numerals.end())
	{
		error(std::to_string(i) + " is out of [1, 3999]");
	}
	return found->second;
}